

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getAnalogies
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FastText *this,int32_t k,string *wordA,string *wordB,
          string *wordC)

{
  DenseMatrix *wordVectors;
  pointer pcVar1;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar2;
  long lVar3;
  long *plVar4;
  real rVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Vector buffer;
  Vector query;
  allocator_type local_f2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f1;
  Vector local_f0;
  int32_t local_dc;
  Vector local_d8;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80 [2];
  long local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_c8 = __return_storage_ptr__;
  Vector::Vector(&local_d8,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  Vector::zero(&local_d8);
  Vector::Vector(&local_f0,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  local_dc = k;
  getWordVector(this,&local_f0,wordA);
  rVar5 = Vector::norm(&local_f0);
  Vector::addVector(&local_d8,&local_f0,1.0 / (rVar5 + 1e-08));
  getWordVector(this,&local_f0,wordB);
  rVar5 = Vector::norm(&local_f0);
  Vector::addVector(&local_d8,&local_f0,-1.0 / (rVar5 + 1e-08));
  getWordVector(this,&local_f0,wordC);
  rVar5 = Vector::norm(&local_f0);
  Vector::addVector(&local_d8,&local_f0,1.0 / (rVar5 + 1e-08));
  lazyComputeWordVectors(this);
  wordVectors = (this->wordVectors_)._M_t.
                super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                ._M_t.
                super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
                .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
  if (wordVectors != (DenseMatrix *)0x0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    pcVar1 = (wordA->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + wordA->_M_string_length);
    local_a0[0] = local_90;
    pcVar1 = (wordB->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar1,pcVar1 + wordB->_M_string_length);
    plVar4 = local_70;
    pcVar1 = (wordC->_M_dataplus)._M_p;
    local_80[0] = plVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar1,pcVar1 + wordC->_M_string_length);
    __l._M_len = 3;
    __l._M_array = &local_c0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60,__l,&local_f1,&local_f2);
    pvVar2 = local_c8;
    getNN(local_c8,this,wordVectors,&local_d8,local_dc,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
    lVar3 = -0x60;
    do {
      if (plVar4 != (long *)plVar4[-2]) {
        operator_delete((long *)plVar4[-2],*plVar4 + 1);
      }
      plVar4 = plVar4 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    free(local_f0.data_.mem_);
    free(local_d8.data_.mem_);
    return pvVar2;
  }
  __assert_fail("wordVectors_",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/fasttext.cc"
                ,0x270,
                "std::vector<std::pair<real, std::string>> fasttext::FastText::getAnalogies(int32_t, const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getAnalogies(
    int32_t k,
    const std::string& wordA,
    const std::string& wordB,
    const std::string& wordC) {
  Vector query(args_->dim);
  query.zero();

  Vector buffer(args_->dim);
  getWordVector(buffer, wordA);
  query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));
  getWordVector(buffer, wordB);
  query.addVector(buffer, -1.0 / (buffer.norm() + 1e-8));
  getWordVector(buffer, wordC);
  query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));

  lazyComputeWordVectors();
  assert(wordVectors_);
  return getNN(*wordVectors_, query, k, {wordA, wordB, wordC});
}